

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

String * __thiscall Lexer::describeCurrentPosition(String *__return_storage_ptr__,Lexer *this)

{
  _Map_pointer ppTVar1;
  _Map_pointer ppTVar2;
  bool bVar3;
  _Elt_pointer pTVar4;
  bool local_51;
  String local_50;
  String local_30;
  
  pTVar4 = (this->m_tokenPosition)._M_cur;
  ppTVar1 = (this->m_tokenPosition)._M_node;
  ppTVar2 = (this->m_tokens)._deque.
            super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  bVar3 = ppTVar1 < ppTVar2;
  if (ppTVar1 == ppTVar2) {
    bVar3 = pTVar4 < (this->m_tokens)._deque.
                     super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
  }
  if (bVar3) {
    ppTVar2 = (this->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    bVar3 = ppTVar2 <= ppTVar1;
    if (ppTVar1 == ppTVar2) {
      bVar3 = (this->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur <= pTVar4;
    }
    if (!bVar3) goto LAB_0011f3fe;
  }
  else {
LAB_0011f3fe:
    local_50._string._M_dataplus._M_p._0_1_ = 0;
    local_51 = true;
    error<bool,bool>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/lexer.h:86: hasValidToken() (%1) does not equal true (%2)"
                     ,(bool *)&local_50,&local_51);
    pTVar4 = (this->m_tokenPosition)._M_cur;
  }
  String::operator+(&local_30,&pTVar4->file,":");
  pTVar4 = (this->m_tokenPosition)._M_cur;
  ppTVar1 = (this->m_tokenPosition)._M_node;
  ppTVar2 = (this->m_tokens)._deque.
            super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  bVar3 = ppTVar1 < ppTVar2;
  if (ppTVar1 == ppTVar2) {
    bVar3 = pTVar4 < (this->m_tokens)._deque.
                     super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
  }
  if (bVar3) {
    ppTVar2 = (this->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    bVar3 = ppTVar2 <= ppTVar1;
    if (ppTVar1 == ppTVar2) {
      bVar3 = (this->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur <= pTVar4;
    }
    if (bVar3) goto LAB_0011f492;
  }
  local_50._string._M_dataplus._M_p._0_1_ = 0;
  local_51 = true;
  error<bool,bool>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/lexer.h:86: hasValidToken() (%1) does not equal true (%2)"
                   ,(bool *)&local_50,&local_51);
  pTVar4 = (this->m_tokenPosition)._M_cur;
LAB_0011f492:
  String::fromNumber(&local_50,pTVar4->line);
  String::operator+(__return_storage_ptr__,&local_30,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_50._string._M_dataplus._M_p._1_7_,local_50._string._M_dataplus._M_p._0_1_)
      != &local_50._string.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_50._string._M_dataplus._M_p._1_7_,
                             local_50._string._M_dataplus._M_p._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._string._M_dataplus._M_p != &local_30._string.field_2) {
    operator_delete(local_30._string._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

String Lexer::describeCurrentPosition()
{
	return token()->file + ":" + token()->line;
}